

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O2

bool __thiscall
Js::SerializationCloner<Js::StreamWriter>::TryCloneObject
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId typeId,Src src,Dst *dst,
          SCADeepCloneType *deepClone)

{
  IRecyclerVisitedObject this_00;
  code *pcVar1;
  uint32 data;
  bool bVar2;
  RegexFlags RVar3;
  scaposition_t sVar4;
  charcount_t len;
  BOOL BVar5;
  uint uVar6;
  Type len_00;
  int iVar7;
  RecyclableObject *obj;
  Engine *this_01;
  JavascriptString *this_02;
  JavascriptDate *pJVar8;
  JavascriptRegExp *this_03;
  JavascriptStringObject *this_04;
  char16 *str_00;
  JavascriptBooleanObject *this_05;
  JavascriptNumberObject *this_06;
  WebAssemblyMemory *this_07;
  ArrayBuffer *obj_00;
  WebAssemblySharedArrayBuffer *pWVar9;
  uchar *bytes;
  WebAssemblyModule *pWVar10;
  SharedArrayBuffer *pSVar11;
  undefined4 *puVar12;
  StreamWriter *pSVar13;
  size_t *value;
  size_t local_60;
  size_t transferredIndex;
  DWORD flags;
  byte bStack_4c;
  InternalString str;
  undefined4 extraout_var;
  
  str.m_content.ptr = (char16_t *)dst;
  obj = VarTo<Js::RecyclableObject>(src);
  sVar4 = StreamWriter::GetPosition(this->m_writer);
  *deepClone = None;
  local_60 = 0;
  if (typeId == TypeIds_ArrayBuffer) {
    this_01 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
              ::GetEngine(&this->
                           super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                         );
    bVar2 = SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::
            TryGetTransferredOrShared(this_01,src,&local_60);
    if (!bVar2) goto LAB_00d60365;
    Write(this,0x1c);
    pSVar13 = this->m_writer;
    value = (size_t *)&flags;
    flags = (undefined4)local_60;
LAB_00d6035b:
    StreamWriter::Write<unsigned_int>(pSVar13,(uint *)value);
    goto LAB_00d60750;
  }
LAB_00d60365:
  bVar2 = JavascriptOperators::IsObjectDetached(src);
  if (bVar2) {
    ScriptContextHolder::ThrowSCAObjectDetached((ScriptContextHolder *)this);
  }
  switch(typeId) {
  case TypeIds_Proxy:
    return false;
  case TypeIds_Object:
    Write(this,0x1b);
  case TypeIds_Array:
  case TypeIds_NativeIntArray:
  case TypeIds_ArrayLast:
  case TypeIds_ArrayLastWithES5:
    *deepClone = Object;
    break;
  case TypeIds_CopyOnAccessNativeIntArray:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCASerialization.cpp"
                                ,0xfd,"(false)","false");
    if (!bVar2) {
LAB_00d60772:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar12 = 0;
  case TypeIds_Function:
  case TypeIds_Error:
  case TypeIds_BigIntObject:
  case TypeIds_SIMDObject:
  case TypeIds_Arguments:
  case TypeIds_Int8Array:
  case TypeIds_Uint8Array:
  case TypeIds_Uint8ClampedArray:
  case TypeIds_Int16Array:
  case TypeIds_Uint16Array:
  case TypeIds_Int32Array:
  case TypeIds_Uint32Array:
  case TypeIds_Float32Array:
  case TypeIds_Float64Array:
  case TypeIds_Int64Array:
  case TypeIds_Uint64Array:
  case TypeIds_CharArray:
  case TypeIds_BoolArray:
  case TypeIds_EngineInterfaceObject:
  case TypeIds_DataView:
  case TypeIds_DataView|TypeIds_Null:
switchD_00d6038b_caseD_1b:
    if (typeId == TypeIds_DataView || typeId - TypeIds_Int8Array < 9) {
      WriteTypedArray(this,typeId,src);
    }
    else {
      *deepClone = HostObject;
    }
    break;
  case TypeIds_Date:
    Write(this,0x17);
    pSVar13 = this->m_writer;
    pJVar8 = VarTo<Js::JavascriptDate>(src);
    _flags = (_func_int **)DateImplementation::GetMilliSeconds(&pJVar8->m_date);
    goto LAB_00d605ba;
  case TypeIds_RegEx:
    this_03 = VarTo<Js::JavascriptRegExp>(src);
    JavascriptRegExp::GetSource((JavascriptRegExp *)&flags);
    RVar3 = JavascriptRegExp::GetFlags(this_03);
    value = &transferredIndex;
    transferredIndex = CONCAT44(transferredIndex._4_4_,(uint)RVar3);
    Write(this,0x1a);
    Write(this,(char16 *)((ulong)((uint)bStack_4c * 2) + str._0_8_),flags);
    pSVar13 = this->m_writer;
    goto LAB_00d6035b;
  case TypeIds_BooleanObject:
    this_05 = VarTo<Js::JavascriptBooleanObject>(src);
    BVar5 = JavascriptBooleanObject::GetValue(this_05);
    Write(this,(BVar5 == 0) + 0x15);
    break;
  case TypeIds_NumberObject:
    Write(this,0x18);
    pSVar13 = this->m_writer;
    this_06 = VarTo<Js::JavascriptNumberObject>(src);
    _flags = (_func_int **)JavascriptNumberObject::GetValue(this_06);
LAB_00d605ba:
    StreamWriter::Write<double>(pSVar13,(double *)&flags);
    break;
  case TypeIds_StringObject:
    this_04 = VarTo<Js::JavascriptStringObject>(src);
    this_02 = JavascriptStringObject::InternalUnwrap(this_04);
    data = 0x19;
LAB_00d60541:
    Write(this,data);
    str_00 = JavascriptString::GetString(this_02);
    len = JavascriptString::GetLength(this_02);
    Write(this,str_00,len);
    break;
  case TypeIds_ArrayBuffer:
    obj_00 = VarTo<Js::ArrayBuffer>(src);
    Write(this,0x3c);
LAB_00d6065c:
    iVar7 = (*(obj_00->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(obj_00);
    bytes = (uchar *)CONCAT44(extraout_var,iVar7);
    len_00 = (*(obj_00->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
               [0x71])(obj_00);
    goto LAB_00d606a1;
  case TypeIds_Map:
    Write(this,0x50);
    *deepClone = Map;
    break;
  case TypeIds_Set:
    Write(this,0x51);
    *deepClone = Set;
    break;
  default:
    if (typeId == TypeIds_WebAssemblyMemory) {
      this_07 = VarTo<Js::WebAssemblyMemory>(src);
      obj_00 = (ArrayBuffer *)WebAssemblyMemory::GetBuffer(this_07);
      Write(this,0x56);
      uVar6 = WebAssemblyMemory::GetInitialLength(this_07);
      Write(this,uVar6);
      uVar6 = WebAssemblyMemory::GetMaximumLength(this_07);
      Write(this,uVar6);
      bVar2 = WebAssemblyMemory::IsSharedMemory(this_07);
      Write(this,(uint)bVar2);
      bVar2 = WebAssemblyMemory::IsSharedMemory(this_07);
      if (bVar2) {
        pWVar9 = VarTo<Js::WebAssemblySharedArrayBuffer,Js::ArrayBufferBase>
                           ((ArrayBufferBase *)obj_00);
        _flags = (_func_int **)
                 (pWVar9->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.sharedContents;
        SharedContents::AddRef((SharedContents *)_flags);
        JsUtil::
        List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this->m_sharedContentsrList,(SharedContents **)&flags);
        goto LAB_00d6073d;
      }
      goto LAB_00d6065c;
    }
    if (typeId == TypeIds_SharedArrayBuffer) {
      pSVar11 = VarTo<Js::SharedArrayBuffer>(src);
      this_00._vptr_IRecyclerVisitedObject = (_func_int **)pSVar11->sharedContents;
      _flags = this_00._vptr_IRecyclerVisitedObject;
      iVar7 = (*(pSVar11->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x6d])(pSVar11);
      if ((bool)(char)iVar7 != *(bool *)(this_00._vptr_IRecyclerVisitedObject + 3)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCASerialization.cpp"
                                    ,0xc3,
                                    "(buf->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly())"
                                    ,
                                    "buf->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly()"
                                   );
        if (!bVar2) goto LAB_00d60772;
        *puVar12 = 0;
      }
      SharedContents::AddRef((SharedContents *)this_00._vptr_IRecyclerVisitedObject);
      JsUtil::
      List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(this->m_sharedContentsrList,(SharedContents **)&flags);
      Write(this,0x52);
LAB_00d6073d:
      transferredIndex = (size_t)_flags;
      StreamWriter::Write<long>(this->m_writer,(long *)&transferredIndex);
      break;
    }
    if (typeId != TypeIds_WebAssemblyModule) {
      if (typeId == TypeIds_String) {
        this_02 = VarTo<Js::JavascriptString,Js::RecyclableObject>(obj);
        data = 8;
        goto LAB_00d60541;
      }
      goto switchD_00d6038b_caseD_1b;
    }
    pWVar10 = VarTo<Js::WebAssemblyModule>(src);
    Write(this,0x55);
    bytes = (pWVar10->m_binaryBuffer).ptr;
    len_00 = pWVar10->m_binaryBufferLength;
LAB_00d606a1:
    Write(this,bytes,len_00);
  }
LAB_00d60750:
  *(scaposition_t *)str.m_content.ptr = sVar4;
  return true;
}

Assistant:

bool SerializationCloner<Writer>::TryCloneObject(SrcTypeId typeId, Src src, Dst* dst, SCADeepCloneType* deepClone)
    {
        RecyclableObject* obj = VarTo<RecyclableObject>(src);
        scaposition_t beginPos = m_writer->GetPosition();
        *deepClone = SCADeepCloneType::None;

        size_t transferredIndex = 0;
        if (this->CanBeTransferred(typeId) && this->GetEngine()->TryGetTransferredOrShared(src, &transferredIndex))
        {
            WriteTypeId(SCA_Transferable);
            m_writer->Write((uint32)transferredIndex);
        }
        else if (JavascriptOperators::IsObjectDetached(src))
        {
            //Object is detached, throw error
            this->ThrowSCAObjectDetached();
        }
        else
        {
            switch (typeId)
            {
            case TypeIds_String: // Clone string value as object type to resolve multiple references
                {
                    JavascriptString* str = VarTo<JavascriptString>(obj);
                    WriteTypeId(SCA_StringValue);
                    Write(str->GetString(), str->GetLength());
                }
                break;

            case TypeIds_Object:
                {
                    WriteTypeId(SCA_Object);
                    *deepClone = SCADeepCloneType::Object;
                }
                break;

            case TypeIds_Proxy:
                {
                // Currently SCA algorithm does not support proxy. We'll see 
                // if the spec will be updated. I don't support QueryObjectInterface in proxy
                // so we don't want to go through the default code path.
                    return false;
                }
            case TypeIds_Array:
            case TypeIds_ES5Array:
            case TypeIds_NativeIntArray:
            case TypeIds_NativeFloatArray:
                {
                    // Postpone writing to CloneProperties
                    *deepClone = SCADeepCloneType::Object;
                }
                break;

            case TypeIds_Date:
                {
                    WriteTypeId(SCA_DateObject);
                    m_writer->Write(VarTo<JavascriptDate>(src)->GetTime());
                }
                break;

            case TypeIds_RegEx:
                {
                    JavascriptRegExp* regex = VarTo<JavascriptRegExp>(src);
                    InternalString str = regex->GetSource();
                    DWORD flags = static_cast<DWORD>(regex->GetFlags());
                    WriteTypeId(SCA_RegExpObject);
                    Write(str.GetBuffer(), str.GetLength());
                    m_writer->Write(flags);
                }
                break;

            case TypeIds_BooleanObject:
                WriteTypeId(VarTo<JavascriptBooleanObject>(src)->GetValue() ?
                    SCA_BooleanTrueObject : SCA_BooleanFalseObject);
                break;

            case TypeIds_NumberObject:
                {
                    WriteTypeId(SCA_NumberObject);
                    m_writer->Write(VarTo<JavascriptNumberObject>(src)->GetValue());
                }
                break;

            case TypeIds_StringObject:
                {
                    JavascriptString* str = VarTo<JavascriptStringObject>(src)->Unwrap();
                    WriteTypeId(SCA_StringObject);
                    Write(str->GetString(), str->GetLength());
                }
                break;

            case TypeIds_ArrayBuffer:
                {
                    ArrayBuffer* buf = VarTo<ArrayBuffer>(src);
                    WriteTypeId(SCA_ArrayBuffer);
                    Write(buf->GetBuffer(), buf->GetByteLength());
                }
                break;

            case TypeIds_SharedArrayBuffer:
                {
                    // TBD

                    //SCAContextType contextType;
                    //if (FAILED(this->m_pSCAContext->GetContext(&contextType)))
                    //{
                    //    return false;
                    //}
                    //
                    //if(contextType == SCAContext_CrossProcess || contextType == SCAContext_Persist)
                    //{
                    //    return false;
                    //}

                    SharedArrayBuffer* buf = VarTo<SharedArrayBuffer>(src);
                    SharedContents* sharedContents = buf->GetSharedContents();
                    Assert(buf->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly());
                    sharedContents->AddRef();
                    this->m_sharedContentsrList->Add(sharedContents);
                    WriteTypeId(SCA_SharedArrayBuffer);
                    m_writer->Write((intptr_t)sharedContents);
                }
                break;

            case TypeIds_Map:
                {
                    WriteTypeId(SCA_Map);
                    *deepClone = SCADeepCloneType::Map;
                }
                break;

            case TypeIds_Set:
                {
                    WriteTypeId(SCA_Set);
                    *deepClone = SCADeepCloneType::Set;
                }
                break;

#ifdef ENABLE_WASM
            case TypeIds_WebAssemblyModule:
                {
                    WebAssemblyModule* wasmModule = VarTo<WebAssemblyModule>(src);
                    WriteTypeId(SCA_WebAssemblyModule);
                    Write(wasmModule->GetBinaryBuffer(), wasmModule->GetBinaryBufferLength());
                }
                break;
            case TypeIds_WebAssemblyMemory:
            {
                WebAssemblyMemory* wasmMem = VarTo<WebAssemblyMemory>(src);
                ArrayBufferBase* buffer = wasmMem->GetBuffer();
                WriteTypeId(SCA_WebAssemblyMemory);
                Write(wasmMem->GetInitialLength());
                Write(wasmMem->GetMaximumLength());
#ifdef ENABLE_WASM_THREADS
                Write((uint32)wasmMem->IsSharedMemory());
                if (wasmMem->IsSharedMemory())
                {
                    WebAssemblySharedArrayBuffer* buf = VarTo<WebAssemblySharedArrayBuffer>(buffer);
                    SharedContents* sharedContents = buf->GetSharedContents();
                    sharedContents->AddRef();
                    this->m_sharedContentsrList->Add(sharedContents);
                    m_writer->Write((intptr_t)sharedContents);
                }
                else
#endif
                {
                    Write(buffer->GetBuffer(), buffer->GetByteLength());
                }
                break;
            }
#endif

#if ENABLE_COPYONACCESS_ARRAY
            case TypeIds_CopyOnAccessNativeIntArray:
                Assert(false);
                // fall-through
#endif

            default:
                if (IsTypedArray(typeId))
                {
                    WriteTypedArray(typeId, src);
                }
                else
                {
                    // Try Host Object
                    *deepClone = SCADeepCloneType::HostObject;
                }
                break;
            }
        }

        *dst = beginPos;
        return true;
    }